

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line.cpp
# Opt level: O0

size_t __thiscall kiste::line_data_t::add_segment(line_data_t *this,segment_t *segment)

{
  bool bVar1;
  reference pcVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_30;
  char c;
  const_iterator __end2;
  const_iterator __begin2;
  string *__range2;
  segment_t *segment_local;
  line_data_t *this_local;
  
  if (segment->_type == text) {
    __end2._M_current = (char *)std::__cxx11::string::begin();
    _Stack_30._M_current = (char *)std::__cxx11::string::end();
    while (bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffd0), bVar1) {
      pcVar2 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end2);
      add_character(this,*pcVar2);
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end2);
    }
  }
  else {
    std::vector<kiste::segment_t,_std::allocator<kiste::segment_t>_>::push_back
              (&this->_segments,segment);
  }
  return segment->_end_pos;
}

Assistant:

auto line_data_t::add_segment(const segment_t& segment) -> size_t
  {
    switch (segment._type)
    {
    case segment_type::text:
      for (const auto c : segment._text)
      {
        add_character(c);
      }
      break;
    default:
      _segments.push_back(segment);
      break;
    }

    return segment._end_pos;
  }